

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void P_SetSafeFlash(AWeapon *weapon,player_t *player,FState *flashstate,int index)

{
  PClass *pPVar1;
  PClassActor *pPVar2;
  FState *pFVar3;
  
  if (flashstate != (FState *)0x0) {
    for (pPVar1 = DObject::GetClass((DObject *)weapon); pPVar1 != AWeapon::RegistrationInfo.MyClass;
        pPVar1 = pPVar1->ParentClass) {
      pFVar3 = *(FState **)
                &pPVar1[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
                 super_PType.super_PTypeBase.super_DObject;
      if ((pFVar3 <= flashstate) &&
         (pFVar3 = pFVar3 + *(int *)((long)&pPVar1[1].super_PNativeStruct.super_PStruct.
                                            super_PNamedType.super_PCompoundType.super_PType.
                                            super_PTypeBase.super_DObject + 0x18),
         flashstate < pFVar3)) {
        if (flashstate + index < pFVar3) {
          flashstate = flashstate + index;
        }
        goto LAB_0043b73b;
      }
    }
    pPVar2 = FState::StaticFindStateOwner(flashstate + index);
    if (pPVar2 == (PClassActor *)0x0) {
      index = 0;
    }
  }
  flashstate = flashstate + index;
LAB_0043b73b:
  P_SetPsprite(player,PSP_FLASH,flashstate,true);
  return;
}

Assistant:

void P_SetSafeFlash(AWeapon *weapon, player_t *player, FState *flashstate, int index)
{
	if (flashstate != nullptr)
	{
		PClassActor *cls = weapon->GetClass();
		while (cls != RUNTIME_CLASS(AWeapon))
		{
			if (flashstate >= cls->OwnedStates && flashstate < cls->OwnedStates + cls->NumOwnedStates)
			{
				// The flash state belongs to this class.
				// Now let's check if the actually wanted state does also
				if (flashstate + index < cls->OwnedStates + cls->NumOwnedStates)
				{
					// we're ok so set the state
					P_SetPsprite(player, PSP_FLASH, flashstate + index, true);
					return;
				}
				else
				{
					// oh, no! The state is beyond the end of the state table so use the original flash state.
					P_SetPsprite(player, PSP_FLASH, flashstate, true);
					return;
				}
			}
			// try again with parent class
			cls = static_cast<PClassActor *>(cls->ParentClass);
		}
		// if we get here the state doesn't seem to belong to any class in the inheritance chain
		// This can happen with Dehacked if the flash states are remapped. 
		// The only way to check this would be to go through all Dehacked modifiable actors, convert
		// their states into a single flat array and find the correct one.
		// Rather than that, just check to make sure it belongs to something.
		if (FState::StaticFindStateOwner(flashstate + index) == NULL)
		{ // Invalid state. With no index offset, it should at least be valid.
			index = 0;
		}
	}
	P_SetPsprite(player, PSP_FLASH, flashstate + index, true);
}